

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Analysis.cpp
# Opt level: O2

void __thiscall Analysis::FlowAnalysis_3D(Analysis *this)

{
  shared_ptr<RandomUtil::Random> *psVar1;
  shared_ptr<particleSamples> *psVar2;
  ostream *poVar3;
  pointer ppsVar4;
  bool bVar5;
  singleParticleSpectra *psVar6;
  singleParticleSpectra **ipart;
  pointer ppsVar7;
  ulong uVar8;
  vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> spvn;
  ParameterReader paraRdr;
  singleParticleSpectra *local_968;
  ostream *local_960;
  _Vector_base<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> local_958;
  ParameterReader local_940;
  int local_90c;
  ulong local_908;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_900;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_8f0;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_8e0;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_8d0;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_8c0;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_8b0;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_8a0;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_890;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_880;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_870;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_860;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_850;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_840;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_830;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_820;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_810;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_800;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_7f0;
  __shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2> local_7e0;
  string local_7d0;
  string local_7b0;
  string local_790;
  string local_770;
  string local_750;
  string local_730;
  string local_710;
  string local_6f0;
  string local_6d0;
  string local_6b0;
  string local_690;
  string local_670;
  string local_650;
  string local_630;
  string local_610;
  string local_5f0;
  string local_5d0;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  ParameterReader::ParameterReader(&local_940,&this->paraRdr_);
  std::__cxx11::string::string((string *)&local_d0,"compute_correlation",(allocator *)&local_958);
  ParameterReader::setVal(&local_940,&local_d0,0.0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::string((string *)&local_f0,"flag_charge_dependence",(allocator *)&local_958)
  ;
  ParameterReader::setVal(&local_940,&local_f0,0.0);
  std::__cxx11::string::~string((string *)&local_f0);
  local_958._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_958._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_958._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_110,"particle_monval",(allocator *)&local_968);
  ParameterReader::setVal(&local_940,&local_110,99999.0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::string((string *)&local_130,"rap_type",(allocator *)&local_968);
  ParameterReader::setVal(&local_940,&local_130,0.0);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::string((string *)&local_150,"rapidity_distribution",(allocator *)&local_968)
  ;
  ParameterReader::setVal(&local_940,&local_150,1.0);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::string
            ((string *)&local_170,"vn_rapidity_dis_pT_min",(allocator *)&local_968);
  ParameterReader::setVal(&local_940,&local_170,0.0);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string
            ((string *)&local_190,"vn_rapidity_dis_pT_max",(allocator *)&local_968);
  ParameterReader::setVal(&local_940,&local_190,4.0);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::string
            ((string *)&local_1b0,"rapidityPTDistributionFlag",(allocator *)&local_968);
  ParameterReader::setVal(&local_940,&local_1b0,1.0);
  std::__cxx11::string::~string((string *)&local_1b0);
  psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_1d0,(string *)this);
  psVar1 = &this->ran_gen_ptr_;
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_7f0,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>)
  ;
  singleParticleSpectra::singleParticleSpectra
            (psVar6,&local_940,&local_1d0,(shared_ptr<RandomUtil::Random> *)&local_7f0);
  local_968 = psVar6;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_958,
             &local_968);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_7f0._M_refcount);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::string((string *)&local_1f0,"particle_monval",(allocator *)&local_968);
  ParameterReader::setVal(&local_940,&local_1f0,9999.0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::string((string *)&local_210,"rap_type",(allocator *)&local_968);
  ParameterReader::setVal(&local_940,&local_210,0.0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::string((string *)&local_230,"rapidity_distribution",(allocator *)&local_968)
  ;
  ParameterReader::setVal(&local_940,&local_230,1.0);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::string
            ((string *)&local_250,"vn_rapidity_dis_pT_min",(allocator *)&local_968);
  ParameterReader::setVal(&local_940,&local_250,0.2);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::string
            ((string *)&local_270,"vn_rapidity_dis_pT_max",(allocator *)&local_968);
  ParameterReader::setVal(&local_940,&local_270,3.0);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::string
            ((string *)&local_290,"rapidityPTDistributionFlag",(allocator *)&local_968);
  ParameterReader::setVal(&local_940,&local_290,0.0);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::string((string *)&local_2b0,"rap_min",(allocator *)&local_968);
  ParameterReader::setVal(&local_940,&local_2b0,-2.5);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::string((string *)&local_2d0,"rap_max",(allocator *)&local_968);
  ParameterReader::setVal(&local_940,&local_2d0,2.5);
  std::__cxx11::string::~string((string *)&local_2d0);
  psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_2f0,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_800,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>)
  ;
  singleParticleSpectra::singleParticleSpectra
            (psVar6,&local_940,&local_2f0,(shared_ptr<RandomUtil::Random> *)&local_800);
  local_968 = psVar6;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_958,
             &local_968);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_800._M_refcount);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::string((string *)&local_310,"rap_min",(allocator *)&local_968);
  ParameterReader::setVal(&local_940,&local_310,0.5);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::string((string *)&local_330,"rap_max",(allocator *)&local_968);
  ParameterReader::setVal(&local_940,&local_330,2.5);
  std::__cxx11::string::~string((string *)&local_330);
  psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_350,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_810,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>)
  ;
  singleParticleSpectra::singleParticleSpectra
            (psVar6,&local_940,&local_350,(shared_ptr<RandomUtil::Random> *)&local_810);
  local_968 = psVar6;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_958,
             &local_968);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_810._M_refcount);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::string((string *)&local_370,"rap_min",(allocator *)&local_968);
  ParameterReader::setVal(&local_940,&local_370,-2.5);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::string((string *)&local_390,"rap_max",(allocator *)&local_968);
  ParameterReader::setVal(&local_940,&local_390,-0.5);
  std::__cxx11::string::~string((string *)&local_390);
  psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_3b0,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_820,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>)
  ;
  singleParticleSpectra::singleParticleSpectra
            (psVar6,&local_940,&local_3b0,(shared_ptr<RandomUtil::Random> *)&local_820);
  local_968 = psVar6;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_958,
             &local_968);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_820._M_refcount);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::string((string *)&local_3d0,"rap_min",(allocator *)&local_968);
  ParameterReader::setVal(&local_940,&local_3d0,-0.5);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::string((string *)&local_3f0,"rap_max",(allocator *)&local_968);
  ParameterReader::setVal(&local_940,&local_3f0,0.5);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::string
            ((string *)&local_410,"rapidityPTDistributionFlag",(allocator *)&local_968);
  ParameterReader::setVal(&local_940,&local_410,1.0);
  std::__cxx11::string::~string((string *)&local_410);
  psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_430,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_830,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>)
  ;
  singleParticleSpectra::singleParticleSpectra
            (psVar6,&local_940,&local_430,(shared_ptr<RandomUtil::Random> *)&local_830);
  local_968 = psVar6;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_958,
             &local_968);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_830._M_refcount);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::string((string *)&local_450,"rap_type",(allocator *)&local_968);
  ParameterReader::setVal(&local_940,&local_450,1.0);
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::string
            ((string *)&local_470,"rapidityPTDistributionFlag",(allocator *)&local_968);
  ParameterReader::setVal(&local_940,&local_470,0.0);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::string((string *)&local_490,"particle_monval",(allocator *)&local_968);
  ParameterReader::setVal(&local_940,&local_490,211.0);
  std::__cxx11::string::~string((string *)&local_490);
  psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_4b0,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_840,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>)
  ;
  singleParticleSpectra::singleParticleSpectra
            (psVar6,&local_940,&local_4b0,(shared_ptr<RandomUtil::Random> *)&local_840);
  local_968 = psVar6;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_958,
             &local_968);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_840._M_refcount);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::__cxx11::string::string((string *)&local_4d0,"particle_monval",(allocator *)&local_968);
  ParameterReader::setVal(&local_940,&local_4d0,-211.0);
  std::__cxx11::string::~string((string *)&local_4d0);
  psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_4f0,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_850,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>)
  ;
  singleParticleSpectra::singleParticleSpectra
            (psVar6,&local_940,&local_4f0,(shared_ptr<RandomUtil::Random> *)&local_850);
  local_968 = psVar6;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_958,
             &local_968);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_850._M_refcount);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::__cxx11::string::string((string *)&local_510,"particle_monval",(allocator *)&local_968);
  ParameterReader::setVal(&local_940,&local_510,321.0);
  std::__cxx11::string::~string((string *)&local_510);
  psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_530,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_860,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>)
  ;
  singleParticleSpectra::singleParticleSpectra
            (psVar6,&local_940,&local_530,(shared_ptr<RandomUtil::Random> *)&local_860);
  local_968 = psVar6;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_958,
             &local_968);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_860._M_refcount);
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::string((string *)&local_550,"particle_monval",(allocator *)&local_968);
  ParameterReader::setVal(&local_940,&local_550,-321.0);
  std::__cxx11::string::~string((string *)&local_550);
  psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_570,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_870,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>)
  ;
  singleParticleSpectra::singleParticleSpectra
            (psVar6,&local_940,&local_570,(shared_ptr<RandomUtil::Random> *)&local_870);
  local_968 = psVar6;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_958,
             &local_968);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_870._M_refcount);
  std::__cxx11::string::~string((string *)&local_570);
  std::__cxx11::string::string((string *)&local_590,"particle_monval",(allocator *)&local_968);
  ParameterReader::setVal(&local_940,&local_590,2212.0);
  std::__cxx11::string::~string((string *)&local_590);
  psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_5b0,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_880,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>)
  ;
  singleParticleSpectra::singleParticleSpectra
            (psVar6,&local_940,&local_5b0,(shared_ptr<RandomUtil::Random> *)&local_880);
  local_968 = psVar6;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_958,
             &local_968);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_880._M_refcount);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::__cxx11::string::string((string *)&local_5d0,"particle_monval",(allocator *)&local_968);
  ParameterReader::setVal(&local_940,&local_5d0,-2212.0);
  std::__cxx11::string::~string((string *)&local_5d0);
  psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_5f0,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_890,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>)
  ;
  singleParticleSpectra::singleParticleSpectra
            (psVar6,&local_940,&local_5f0,(shared_ptr<RandomUtil::Random> *)&local_890);
  local_968 = psVar6;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_958,
             &local_968);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_890._M_refcount);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::__cxx11::string::string
            ((string *)&local_610,"resonance_weak_feed_down_flag",(allocator *)&local_968);
  local_960 = (ostream *)ParameterReader::getVal(&local_940,&local_610);
  std::__cxx11::string::~string((string *)&local_610);
  if (((double)local_960 == 0.0) && (!NAN((double)local_960))) {
    std::__cxx11::string::string((string *)&local_630,"particle_monval",(allocator *)&local_968);
    ParameterReader::setVal(&local_940,&local_630,3122.0);
    std::__cxx11::string::~string((string *)&local_630);
    psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
    std::__cxx11::string::string((string *)&local_650,(string *)this);
    std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_8a0,
               &psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>);
    singleParticleSpectra::singleParticleSpectra
              (psVar6,&local_940,&local_650,(shared_ptr<RandomUtil::Random> *)&local_8a0);
    local_968 = psVar6;
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    emplace_back<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_958,
               &local_968);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_8a0._M_refcount);
    std::__cxx11::string::~string((string *)&local_650);
    std::__cxx11::string::string((string *)&local_670,"particle_monval",(allocator *)&local_968);
    ParameterReader::setVal(&local_940,&local_670,-3122.0);
    std::__cxx11::string::~string((string *)&local_670);
    psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
    std::__cxx11::string::string((string *)&local_690,(string *)this);
    std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_8b0,
               &psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>);
    singleParticleSpectra::singleParticleSpectra
              (psVar6,&local_940,&local_690,(shared_ptr<RandomUtil::Random> *)&local_8b0);
    local_968 = psVar6;
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    emplace_back<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_958,
               &local_968);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_8b0._M_refcount);
    std::__cxx11::string::~string((string *)&local_690);
    std::__cxx11::string::string((string *)&local_6b0,"particle_monval",(allocator *)&local_968);
    ParameterReader::setVal(&local_940,&local_6b0,3312.0);
    std::__cxx11::string::~string((string *)&local_6b0);
    psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
    std::__cxx11::string::string((string *)&local_6d0,(string *)this);
    std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_8c0,
               &psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>);
    singleParticleSpectra::singleParticleSpectra
              (psVar6,&local_940,&local_6d0,(shared_ptr<RandomUtil::Random> *)&local_8c0);
    local_968 = psVar6;
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    emplace_back<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_958,
               &local_968);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_8c0._M_refcount);
    std::__cxx11::string::~string((string *)&local_6d0);
    std::__cxx11::string::string((string *)&local_6f0,"particle_monval",(allocator *)&local_968);
    ParameterReader::setVal(&local_940,&local_6f0,-3312.0);
    std::__cxx11::string::~string((string *)&local_6f0);
    psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
    std::__cxx11::string::string((string *)&local_710,(string *)this);
    std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_8d0,
               &psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>);
    singleParticleSpectra::singleParticleSpectra
              (psVar6,&local_940,&local_710,(shared_ptr<RandomUtil::Random> *)&local_8d0);
    local_968 = psVar6;
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    emplace_back<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_958,
               &local_968);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_8d0._M_refcount);
    std::__cxx11::string::~string((string *)&local_710);
    std::__cxx11::string::string((string *)&local_730,"particle_monval",(allocator *)&local_968);
    ParameterReader::setVal(&local_940,&local_730,3334.0);
    std::__cxx11::string::~string((string *)&local_730);
    psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
    std::__cxx11::string::string((string *)&local_750,(string *)this);
    std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_8e0,
               &psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>);
    singleParticleSpectra::singleParticleSpectra
              (psVar6,&local_940,&local_750,(shared_ptr<RandomUtil::Random> *)&local_8e0);
    local_968 = psVar6;
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    emplace_back<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_958,
               &local_968);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_8e0._M_refcount);
    std::__cxx11::string::~string((string *)&local_750);
    std::__cxx11::string::string((string *)&local_770,"particle_monval",(allocator *)&local_968);
    ParameterReader::setVal(&local_940,&local_770,-3334.0);
    std::__cxx11::string::~string((string *)&local_770);
    psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
    std::__cxx11::string::string((string *)&local_790,(string *)this);
    std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_8f0,
               &psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>);
    singleParticleSpectra::singleParticleSpectra
              (psVar6,&local_940,&local_790,(shared_ptr<RandomUtil::Random> *)&local_8f0);
    local_968 = psVar6;
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    emplace_back<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_958,
               &local_968);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_8f0._M_refcount);
    std::__cxx11::string::~string((string *)&local_790);
    std::__cxx11::string::string((string *)&local_7b0,"particle_monval",(allocator *)&local_968);
    ParameterReader::setVal(&local_940,&local_7b0,333.0);
    std::__cxx11::string::~string((string *)&local_7b0);
    psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
    std::__cxx11::string::string((string *)&local_7d0,(string *)this);
    std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_900,
               &psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>);
    singleParticleSpectra::singleParticleSpectra
              (psVar6,&local_940,&local_7d0,(shared_ptr<RandomUtil::Random> *)&local_900);
    local_968 = psVar6;
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    emplace_back<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_958,
               &local_968);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_900._M_refcount);
    std::__cxx11::string::~string((string *)&local_7d0);
  }
  psVar2 = &this->particle_list_;
  local_960 = (ostream *)&this->messager;
  uVar8 = 0;
  while (bVar5 = particleSamples::end_of_file
                           ((psVar2->super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr), ppsVar4 = local_958._M_impl.super__Vector_impl_data._M_finish
        , ppsVar7 = local_958._M_impl.super__Vector_impl_data._M_start, !bVar5) {
    std::operator<<(local_960,"Reading event: ");
    poVar3 = local_960;
    std::ostream::operator<<(local_960,(int)uVar8 + 1);
    std::operator<<(poVar3," ... ");
    std::__cxx11::string::string((string *)&local_50,"info",(allocator *)&local_968);
    pretty_ostream::flush((pretty_ostream *)local_960,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    local_90c = particleSamples::read_in_particle_samples
                          ((psVar2->super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>)
                           ._M_ptr);
    std::operator<<(local_960,"nev = ");
    std::ostream::operator<<(local_960,local_90c);
    std::__cxx11::string::string((string *)&local_70,"info",(allocator *)&local_968);
    pretty_ostream::flush((pretty_ostream *)local_960,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::string((string *)&local_90," processing ...",(allocator *)&local_968);
    local_908 = uVar8;
    pretty_ostream::info((pretty_ostream *)local_960,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    ppsVar4 = local_958._M_impl.super__Vector_impl_data._M_finish;
    for (ppsVar7 = local_958._M_impl.super__Vector_impl_data._M_start; ppsVar7 != ppsVar4;
        ppsVar7 = ppsVar7 + 1) {
      particleSamples::filter_particles_from_events
                ((psVar2->super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                 (*ppsVar7)->particle_monval);
      psVar6 = *ppsVar7;
      std::__shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_7e0,&psVar2->super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>
                );
      singleParticleSpectra::calculate_Qn_vector_shell
                (psVar6,(shared_ptr<particleSamples> *)&local_7e0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_7e0._M_refcount);
    }
    std::__cxx11::string::string((string *)&local_b0,"done!",(allocator *)&local_968);
    pretty_ostream::info((pretty_ostream *)local_960,&local_b0);
    uVar8 = local_908;
    std::__cxx11::string::~string((string *)&local_b0);
    uVar8 = (ulong)(uint)(local_90c + (int)uVar8);
  }
  for (; ppsVar7 != ppsVar4; ppsVar7 = ppsVar7 + 1) {
    singleParticleSpectra::output_spectra_and_Qn_results(*ppsVar7);
  }
  if (local_958._M_impl.super__Vector_impl_data._M_finish !=
      local_958._M_impl.super__Vector_impl_data._M_start) {
    local_958._M_impl.super__Vector_impl_data._M_finish =
         local_958._M_impl.super__Vector_impl_data._M_start;
  }
  std::_Vector_base<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::
  ~_Vector_base(&local_958);
  ParameterReader::~ParameterReader(&local_940);
  return;
}

Assistant:

void Analysis::FlowAnalysis_3D() {
    ParameterReader paraRdr = paraRdr_;
    paraRdr.setVal("compute_correlation", 0);
    paraRdr.setVal("flag_charge_dependence", 0);

    // first define all the analysis sets
    std::vector<singleParticleSpectra *> spvn;

    // all hadrons (99999) first (collect E_T)
    paraRdr.setVal("particle_monval", 99999);
    paraRdr.setVal("rap_type", 0);
    paraRdr.setVal("rapidity_distribution", 1);
    paraRdr.setVal("vn_rapidity_dis_pT_min", 0.);
    paraRdr.setVal("vn_rapidity_dis_pT_max", 4.);
    paraRdr.setVal("rapidityPTDistributionFlag", 1);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));

    // charged hadron first
    paraRdr.setVal("particle_monval", 9999);
    paraRdr.setVal("rap_type", 0);
    paraRdr.setVal("rapidity_distribution", 1);
    paraRdr.setVal("vn_rapidity_dis_pT_min", 0.2);
    paraRdr.setVal("vn_rapidity_dis_pT_max", 3.0);
    paraRdr.setVal("rapidityPTDistributionFlag", 0);
    paraRdr.setVal("rap_min", -2.5);
    paraRdr.setVal("rap_max", 2.5);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("rap_min", 0.5);
    paraRdr.setVal("rap_max", 2.5);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("rap_min", -2.5);
    paraRdr.setVal("rap_max", -0.5);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("rap_min", -0.5);
    paraRdr.setVal("rap_max", 0.5);
    paraRdr.setVal("rapidityPTDistributionFlag", 1);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));

    // now identified particle
    paraRdr.setVal("rap_type", 1);
    paraRdr.setVal("rapidityPTDistributionFlag", 0);
    paraRdr.setVal("particle_monval", 211);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", -211);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", 321);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", -321);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", 2212);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", -2212);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    if (paraRdr.getVal("resonance_weak_feed_down_flag") == 0) {
        paraRdr.setVal("particle_monval", 3122);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", -3122);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", 3312);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", -3312);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", 3334);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", -3334);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", 333);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    }

    // start the loop
    int event_id = 0;
    while (!particle_list_->end_of_file()) {
        messager << "Reading event: " << event_id + 1 << " ... ";
        messager.flush("info");
        int nev = particle_list_->read_in_particle_samples();
        messager << "nev = " << nev;
        messager.flush("info");
        messager.info(" processing ...");
        for (auto &ipart : spvn) {
            int particle_monval = ipart->get_monval();
            particle_list_->filter_particles_from_events(particle_monval);
            ipart->calculate_Qn_vector_shell(particle_list_);
        }
        messager.info("done!");
        event_id += nev;
    }
    for (auto &ipart : spvn) ipart->output_spectra_and_Qn_results();
    spvn.clear();
}